

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

bool __thiscall
wasm::OptimizeInstructions::areConsecutiveInputsEqualAndRemovable
          (OptimizeInstructions *this,Expression *left,Expression *right)

{
  bool bVar1;
  PassOptions *pPVar2;
  Module *pMVar3;
  bool local_321;
  EffectAnalyzer local_300;
  EffectAnalyzer local_190;
  PassOptions *local_30;
  PassOptions *passOptions;
  Expression *right_local;
  Expression *left_local;
  OptimizeInstructions *this_local;
  
  passOptions = (PassOptions *)right;
  right_local = left;
  left_local = (Expression *)this;
  pPVar2 = Pass::getPassOptions((Pass *)this);
  local_30 = pPVar2;
  pMVar3 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
           getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                      ).
                      super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      .
                      super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    );
  EffectAnalyzer::EffectAnalyzer(&local_190,pPVar2,pMVar3,right_local);
  bVar1 = EffectAnalyzer::hasUnremovableSideEffects(&local_190);
  pPVar2 = local_30;
  local_321 = true;
  if (!bVar1) {
    pMVar3 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      );
    EffectAnalyzer::EffectAnalyzer(&local_300,pPVar2,pMVar3,(Expression *)passOptions);
    local_321 = EffectAnalyzer::hasUnremovableSideEffects(&local_300);
    EffectAnalyzer::~EffectAnalyzer(&local_300);
  }
  EffectAnalyzer::~EffectAnalyzer(&local_190);
  if (local_321 == false) {
    this_local._7_1_ = areConsecutiveInputsEqual(this,right_local,(Expression *)passOptions);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool areConsecutiveInputsEqualAndRemovable(Expression* left,
                                             Expression* right) {
    // First, check for side effects. If there are any, then we can't even
    // assume things like local.get's of the same index being identical. (It is
    // also ok to have removable side effects here, see the function
    // description.)
    auto& passOptions = getPassOptions();
    if (EffectAnalyzer(passOptions, *getModule(), left)
          .hasUnremovableSideEffects() ||
        EffectAnalyzer(passOptions, *getModule(), right)
          .hasUnremovableSideEffects()) {
      return false;
    }

    return areConsecutiveInputsEqual(left, right);
  }